

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_keypair_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_ge *pk,
              secp256k1_keypair *keypair)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  secp256k1_ge *psVar4;
  byte bVar5;
  
  bVar5 = 0;
  if (ctx->declassify != 0) {
    secp256k1_keypair_load_cold_1();
  }
  uVar1 = secp256k1_pubkey_load(ctx,pk,(secp256k1_pubkey *)(keypair->data + 0x20));
  if (sk != (secp256k1_scalar *)0x0) {
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else {
      iVar2 = secp256k1_scalar_set_b32_seckey(sk,keypair->data);
      if (ctx->declassify != 0) {
        secp256k1_keypair_load_cold_2();
      }
      if (iVar2 == 0) {
        secp256k1_keypair_load_cold_3();
      }
      uVar1 = (uint)(iVar2 != 0);
    }
  }
  if (uVar1 == 0) {
    psVar4 = &secp256k1_ge_const_g;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pk->x).n[0] = (psVar4->x).n[0];
      psVar4 = (secp256k1_ge *)((long)psVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      pk = (secp256k1_ge *)((long)pk + (ulong)bVar5 * -0x10 + 8);
    }
    if (sk != (secp256k1_scalar *)0x0) {
      sk->d[2] = 0;
      sk->d[3] = 0;
      sk->d[0] = 1;
      sk->d[1] = 0;
    }
  }
  return uVar1;
}

Assistant:

static int secp256k1_keypair_load(const secp256k1_context* ctx, secp256k1_scalar *sk, secp256k1_ge *pk, const secp256k1_keypair *keypair) {
    int ret;
    const secp256k1_pubkey *pubkey = (const secp256k1_pubkey *)&keypair->data[32];

    /* Need to declassify the pubkey because pubkey_load ARG_CHECKs if it's
     * invalid. */
    secp256k1_declassify(ctx, pubkey, sizeof(*pubkey));
    ret = secp256k1_pubkey_load(ctx, pk, pubkey);
    if (sk != NULL) {
        ret = ret && secp256k1_keypair_seckey_load(ctx, sk, keypair);
    }
    if (!ret) {
        *pk = secp256k1_ge_const_g;
        if (sk != NULL) {
            *sk = secp256k1_scalar_one;
        }
    }
    return ret;
}